

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

int secp256k1_musig_partial_sign
              (secp256k1_context *ctx,secp256k1_musig_partial_sig *partial_sig,
              secp256k1_musig_secnonce *secnonce,secp256k1_keypair *keypair,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_musig_session *session)

{
  secp256k1_scalar *r;
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  secp256k1_scalar sk;
  secp256k1_scalar k [2];
  secp256k1_ge pk;
  secp256k1_ge keypair_pk;
  secp256k1_scalar s;
  secp256k1_scalar mu;
  secp256k1_musig_session_internal session_i;
  secp256k1_keyagg_cache_internal cache_i;
  
  if (secnonce == (secp256k1_musig_secnonce *)0x0) {
    (*(ctx->illegal_callback).fn)("secnonce != NULL",(ctx->illegal_callback).data);
    return 0;
  }
  iVar1 = secp256k1_memcmp_var(secnonce,secp256k1_musig_secnonce_magic,4);
  if (iVar1 == 0) {
    cache_i.pk.x.n[0]._0_4_ = secp256k1_is_zero_array(secnonce->data + 4,0x40);
    secp256k1_declassify(ctx,&cache_i,4);
    if ((int)cache_i.pk.x.n[0] == 0) {
      secp256k1_scalar_set_b32(k,secnonce->data + 4,(int *)0x0);
      r = k + 1;
      secp256k1_scalar_set_b32(r,secnonce->data + 0x24,(int *)0x0);
      secp256k1_ge_from_bytes(&pk,secnonce->data + 0x44);
      memset(secnonce,0,0x84);
      if (partial_sig == (secp256k1_musig_partial_sig *)0x0) {
        (*(ctx->illegal_callback).fn)("partial_sig != NULL",(ctx->illegal_callback).data);
        return 0;
      }
      if (keypair == (secp256k1_keypair *)0x0) {
        pvVar2 = (ctx->illegal_callback).data;
        pcVar3 = "keypair != NULL";
      }
      else if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
        pvVar2 = (ctx->illegal_callback).data;
        pcVar3 = "keyagg_cache != NULL";
      }
      else {
        if (session != (secp256k1_musig_session *)0x0) {
          iVar1 = secp256k1_keypair_load(ctx,&sk,&keypair_pk,keypair);
          if (iVar1 != 0) {
            iVar1 = secp256k1_fe_equal(&pk.x,&keypair_pk.x);
            if ((iVar1 == 0) || (iVar1 = secp256k1_fe_equal(&pk.y,&keypair_pk.y), iVar1 == 0)) {
              pvVar2 = (ctx->illegal_callback).data;
              pcVar3 = 
              "secp256k1_fe_equal(&pk.x, &keypair_pk.x) && secp256k1_fe_equal(&pk.y, &keypair_pk.y)"
              ;
              goto LAB_0010a23b;
            }
            iVar1 = secp256k1_keyagg_cache_load(ctx,&cache_i,keyagg_cache);
            if (iVar1 != 0) {
              if (((uint)cache_i.pk.y.n[0] & 1) != cache_i.parity_acc) {
                secp256k1_scalar_negate(&sk,&sk);
              }
              secp256k1_musig_keyaggcoef(&mu,&cache_i,&pk);
              secp256k1_scalar_mul(&sk,&sk,&mu);
              iVar1 = secp256k1_musig_session_load(ctx,&session_i,session);
              if (iVar1 != 0) {
                if (session_i.fin_nonce_parity != 0) {
                  secp256k1_scalar_negate(k,k);
                  secp256k1_scalar_negate(r,r);
                }
                secp256k1_scalar_mul(&s,&session_i.challenge,&sk);
                secp256k1_scalar_mul(r,&session_i.noncecoef,r);
                secp256k1_scalar_add(k,k,r);
                secp256k1_scalar_add(&s,&s,k);
                secp256k1_musig_partial_sig_save(partial_sig,&s);
                secp256k1_musig_partial_sign_clear(&sk,k);
                return 1;
              }
            }
          }
          secp256k1_musig_partial_sign_clear(&sk,k);
          return 0;
        }
        pvVar2 = (ctx->illegal_callback).data;
        pcVar3 = "session != NULL";
      }
LAB_0010a23b:
      (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
      return 0;
    }
    (*(ctx->illegal_callback).fn)("!is_zero",(ctx->illegal_callback).data);
  }
  else {
    (*(ctx->illegal_callback).fn)
              ("secp256k1_memcmp_var(&secnonce->data[0], secp256k1_musig_secnonce_magic, 4) == 0",
               (ctx->illegal_callback).data);
  }
  memset(secnonce,0,0x84);
  secp256k1_musig_partial_sign_clear(&sk,k);
  return 0;
}

Assistant:

int secp256k1_musig_partial_sign(const secp256k1_context* ctx, secp256k1_musig_partial_sig *partial_sig, secp256k1_musig_secnonce *secnonce, const secp256k1_keypair *keypair, const secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_musig_session *session) {
    secp256k1_scalar sk;
    secp256k1_ge pk, keypair_pk;
    secp256k1_scalar k[2];
    secp256k1_scalar mu, s;
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_musig_session_internal session_i;
    int ret;

    VERIFY_CHECK(ctx != NULL);

    ARG_CHECK(secnonce != NULL);
    /* Fails if the magic doesn't match */
    ret = secp256k1_musig_secnonce_load(ctx, k, &pk, secnonce);
    /* Set nonce to zero to avoid nonce reuse. This will cause subsequent calls
     * of this function to fail */
    memset(secnonce, 0, sizeof(*secnonce));
    if (!ret) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    ARG_CHECK(partial_sig != NULL);
    ARG_CHECK(keypair != NULL);
    ARG_CHECK(keyagg_cache != NULL);
    ARG_CHECK(session != NULL);

    if (!secp256k1_keypair_load(ctx, &sk, &keypair_pk, keypair)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }
    ARG_CHECK(secp256k1_fe_equal(&pk.x, &keypair_pk.x)
              && secp256k1_fe_equal(&pk.y, &keypair_pk.y));
    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    /* Negate sk if secp256k1_fe_is_odd(&cache_i.pk.y)) XOR cache_i.parity_acc.
     * This corresponds to the line "Let d = g⋅gacc⋅d' mod n" in the
     * specification. */
    if ((secp256k1_fe_is_odd(&cache_i.pk.y)
         != cache_i.parity_acc)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    /* Multiply KeyAgg coefficient */
    secp256k1_musig_keyaggcoef(&mu, &cache_i, &pk);
    secp256k1_scalar_mul(&sk, &sk, &mu);

    if (!secp256k1_musig_session_load(ctx, &session_i, session)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    if (session_i.fin_nonce_parity) {
        secp256k1_scalar_negate(&k[0], &k[0]);
        secp256k1_scalar_negate(&k[1], &k[1]);
    }

    /* Sign */
    secp256k1_scalar_mul(&s, &session_i.challenge, &sk);
    secp256k1_scalar_mul(&k[1], &session_i.noncecoef, &k[1]);
    secp256k1_scalar_add(&k[0], &k[0], &k[1]);
    secp256k1_scalar_add(&s, &s, &k[0]);
    secp256k1_musig_partial_sig_save(partial_sig, &s);
    secp256k1_musig_partial_sign_clear(&sk, k);
    return 1;
}